

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Bundle::calculateLength(Bundle *this)

{
  bool bVar1;
  KUINT16 KVar2;
  pointer this_00;
  reference this_01;
  Header6 *this_02;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_50;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_48;
  const_iterator citrRefEnd;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
  local_38;
  const_iterator citrRef;
  __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
  local_28;
  const_iterator citrObjEnd;
  __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
  local_18;
  const_iterator citrObj;
  Bundle *this_local;
  
  this->m_ui16Length = 0;
  citrObj._M_current = (KDataStream *)this;
  citrObjEnd._M_current =
       (KDataStream *)
       std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::begin(&this->m_vStreams);
  __gnu_cxx::
  __normal_iterator<KDIS::KDataStream_const*,std::vector<KDIS::KDataStream,std::allocator<KDIS::KDataStream>>>
  ::__normal_iterator<KDIS::KDataStream*>
            ((__normal_iterator<KDIS::KDataStream_const*,std::vector<KDIS::KDataStream,std::allocator<KDIS::KDataStream>>>
              *)&local_18,
             (__normal_iterator<KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
              *)&citrObjEnd);
  citrRef._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::end(&this->m_vStreams);
  __gnu_cxx::
  __normal_iterator<KDIS::KDataStream_const*,std::vector<KDIS::KDataStream,std::allocator<KDIS::KDataStream>>>
  ::__normal_iterator<KDIS::KDataStream*>
            ((__normal_iterator<KDIS::KDataStream_const*,std::vector<KDIS::KDataStream,std::allocator<KDIS::KDataStream>>>
              *)&local_28,
             (__normal_iterator<KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
              *)&citrRef);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
              ::operator->(&local_18);
    KVar2 = KDataStream::GetBufferSize(this_00);
    this->m_ui16Length = this->m_ui16Length + KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::KDataStream_*,_std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>_>
    ::operator++(&local_18);
  }
  citrRefEnd._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
       ::begin(&this->m_vRefHeaders);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
              *)&local_38,
             (__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
              *)&citrRefEnd);
  local_50._M_current =
       (KRef_Ptr<KDIS::PDU::Header7> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
       ::end(&this->m_vRefHeaders);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>>>>
              *)&local_48,&local_50);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
              ::operator*(&local_38);
    this_02 = &UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(this_01)->super_Header6;
    KVar2 = Header6::GetPDULength(this_02);
    this->m_ui16Length = this->m_ui16Length + KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void Bundle::calculateLength()
{
    m_ui16Length = 0;

    vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    for( ; citrObj != citrObjEnd; ++citrObj )
    {
        m_ui16Length += citrObj->GetBufferSize();
    }

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        m_ui16Length += ( *citrRef )->GetPDULength();
    }
}